

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printing.cpp
# Opt level: O0

void __thiscall PrintingTest_Print_Test::TestBody(PrintingTest_Print_Test *this)

{
  __node_base_ptr __s;
  bool bVar1;
  Function *pFVar2;
  char *pcVar3;
  Name NVar4;
  Name NVar5;
  AssertHelper local_7f0;
  Message local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar_1;
  stringstream local_7a0 [8];
  stringstream ss_1;
  ostream local_790 [376];
  AssertHelper local_618;
  Message local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar;
  stringstream local_5c8 [8];
  stringstream ss;
  ostream local_5b8 [399];
  allocator<char> local_429;
  string local_428;
  undefined1 local_408 [8];
  Module wasm;
  char *moduleText;
  PrintingTest_Print_Test *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_24a610;
  ::wasm::Module::Module((Module *)local_408);
  __s = wasm.tagsMap._M_h._M_single_bucket;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,(char *)__s,&local_429);
  PrintTest::parseWast(&this->super_PrintingTest,(Module *)local_408,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::stringstream::stringstream(local_5c8);
  ::wasm::Name::Name((Name *)&gtest_ar.message_,"a");
  NVar4.super_IString.str._M_str =
       (char *)gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  NVar4.super_IString.str._M_len = (size_t)local_408;
  pFVar2 = (Function *)::wasm::Module::getFunction(NVar4);
  std::operator<<(local_5b8,pFVar2);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[41],_nullptr>
            ((EqHelper *)local_5e8,"ss.str()",
             "R\"print((func $a (result i32)\n (i32.const 10)\n)\n)print\"",&local_608,
             (char (*) [41])"(func $a (result i32)\n (i32.const 10)\n)\n");
  std::__cxx11::string::~string((string *)&local_608);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/printing.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=(&local_618,&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
  std::__cxx11::stringstream::~stringstream(local_5c8);
  std::__cxx11::stringstream::stringstream(local_7a0);
  ::wasm::Name::Name((Name *)&gtest_ar_1.message_,"b");
  NVar5.super_IString.str._M_str =
       (char *)gtest_ar_1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  NVar5.super_IString.str._M_len = (size_t)local_408;
  pFVar2 = (Function *)::wasm::Module::getFunction(NVar5);
  std::operator<<(local_790,pFVar2);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[39],_nullptr>
            ((EqHelper *)local_7c0,"ss.str()",
             "R\"print((func $b\n (drop\n  (i32.const 20)\n )\n)\n)print\"",&local_7e0,
             (char (*) [39])"(func $b\n (drop\n  (i32.const 20)\n )\n)\n");
  std::__cxx11::string::~string((string *)&local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/printing.cpp"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  std::__cxx11::stringstream::~stringstream(local_7a0);
  ::wasm::Module::~Module((Module *)local_408);
  return;
}

Assistant:

TEST_F(PrintingTest, Print) {
  auto moduleText = R"wasm(
    (module
      (func $a (result i32)
        (i32.const 10)
      )
      (func $b
        (drop
          (i32.const 20)
        )
      )
    )
  )wasm";

  Module wasm;
  parseWast(wasm, moduleText);

  {
    std::stringstream ss;
    ss << *wasm.getFunction("a");
    EXPECT_EQ(ss.str(), R"print((func $a (result i32)
 (i32.const 10)
)
)print");
  }
  {
    std::stringstream ss;
    ss << *wasm.getFunction("b");
    EXPECT_EQ(ss.str(), R"print((func $b
 (drop
  (i32.const 20)
 )
)
)print");
  }
}